

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separable_info.c
# Opt level: O0

double inform_separable_info
                 (int *srcs,int *dest,size_t l,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  double dVar2;
  ulong local_50;
  size_t i;
  double si;
  int b_local;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *dest_local;
  int *srcs_local;
  
  if (l == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
    srcs_local = (int *)0x7ff8000000000000;
  }
  else {
    i = (size_t)inform_active_info(dest,n,m,b,k,err);
    _Var1 = inform_failed(err);
    if (_Var1) {
      srcs_local = (int *)0x7ff8000000000000;
    }
    else {
      dest_local = srcs;
      for (local_50 = 0; local_50 < l; local_50 = local_50 + 1) {
        dVar2 = inform_transfer_entropy(dest_local,dest,(int *)0x0,0,n,m,b,k,err);
        i = (size_t)(dVar2 + (double)i);
        _Var1 = inform_failed(err);
        if (_Var1) {
          return NAN;
        }
        dest_local = dest_local + n * m;
      }
      srcs_local = (int *)i;
    }
  }
  return (double)srcs_local;
}

Assistant:

double inform_separable_info(int const *srcs, int const *dest, size_t l,
    size_t n, size_t m, int b, size_t k, inform_error *err)
{
    if (l < 1) INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, NAN);

    double si = inform_active_info(dest, n, m, b, k, err);
    if (inform_failed(err)) return NAN;

    for (size_t i = 0; i < l; ++i, srcs += n*m)
    {
        si += inform_transfer_entropy(srcs, dest, NULL, 0, n, m, b, k, err);
        if (inform_failed(err)) return NAN;
    }

    return si;
}